

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::matrix<double>::copy_elements__(matrix<double> *this,matrix<double> *m)

{
  size_t sVar1;
  size_t sVar2;
  element_t *peVar3;
  element_t *peVar4;
  size_t i;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  
  sVar1 = m->rows__;
  this->rows__ = sVar1;
  sVar2 = m->columns__;
  this->columns__ = sVar2;
  for (sVar5 = 0; sVar5 != sVar1; sVar5 = sVar5 + 1) {
    peVar3 = m->elements__;
    peVar4 = this->elements__;
    lVar6 = 0;
    sVar7 = sVar2;
    while (bVar9 = sVar7 != 0, sVar7 = sVar7 - 1, bVar9) {
      lVar8 = (lVar6 >> 0x20) + sVar5 * sVar2;
      peVar4[lVar8] = peVar3[lVar8];
      lVar6 = lVar6 + 0x100000000;
    }
  }
  return;
}

Assistant:

void copy_elements__(const matrix& m)
      { 
        rows__=m.rows__; columns__=m.columns__;
        for(size_t i=0; i<rows__; i++) 
          for(size_t j=0; j<columns__; j++) elements__[offset__(i,j)]=m.elements__[offset__(i,j)]; 
      }